

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  size_t itime;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar39;
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  undefined1 auVar42 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1f0;
  size_t local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  undefined1 local_f8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_188._8_4_ = 0x7f800000;
  local_188._0_8_ = 0x7f8000007f800000;
  local_188._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_198._8_4_ = 0xff800000;
  local_198._0_8_ = 0xff800000ff800000;
  local_198._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar23._8_8_ = 0;
  auVar23._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar23._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar27._8_8_ = 0;
  auVar27._0_4_ = time_range->lower;
  auVar27._4_4_ = time_range->upper;
  uVar14 = vcmpps_avx512vl(auVar23,auVar27,1);
  auVar24 = vinsertps_avx(auVar27,auVar23,0x50);
  auVar23 = vinsertps_avx(auVar23,auVar27,0x50);
  bVar8 = (bool)((byte)uVar14 & 1);
  local_b8._0_4_ = (float)((uint)bVar8 * auVar24._0_4_ | (uint)!bVar8 * auVar23._0_4_);
  bVar8 = (bool)((byte)(uVar14 >> 1) & 1);
  local_b8._4_4_ = (uint)bVar8 * auVar24._4_4_ | (uint)!bVar8 * auVar23._4_4_;
  bVar8 = (bool)((byte)(uVar14 >> 2) & 1);
  local_b8._8_4_ = (uint)bVar8 * auVar24._8_4_ | (uint)!bVar8 * auVar23._8_4_;
  bVar8 = (bool)((byte)(uVar14 >> 3) & 1);
  local_b8._12_4_ = (uint)bVar8 * auVar24._12_4_ | (uint)!bVar8 * auVar23._12_4_;
  auVar45 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar46 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    uVar14 = r->_begin;
    if (uVar14 < r->_end) {
      local_1f0 = 0;
      auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar49 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar51 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      local_1b8._8_4_ = 0x7f800000;
      local_1b8._0_8_ = 0x7f8000007f800000;
      local_1b8._12_4_ = 0x7f800000;
      local_188._8_4_ = 0x7f800000;
      local_188._0_8_ = 0x7f8000007f800000;
      local_188._12_4_ = 0x7f800000;
      local_1a8._8_4_ = 0xff800000;
      local_1a8._0_8_ = 0xff800000ff800000;
      local_1a8._12_4_ = 0xff800000;
      local_198._8_4_ = 0xff800000;
      local_198._0_8_ = 0xff800000ff800000;
      local_198._12_4_ = 0xff800000;
      local_1c0 = k;
      do {
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar24._8_8_ = 0;
        auVar24._0_4_ = BVar2.lower;
        auVar24._4_4_ = BVar2.upper;
        auVar24 = vmovshdup_avx(auVar24);
        fVar22 = BVar2.lower;
        fVar32 = auVar45._0_4_ - fVar22;
        fVar20 = auVar24._0_4_ - fVar22;
        uVar3 = *(uint *)(*(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>
                                   ).super_CurveGeometry.field_0x68 * uVar14);
        uVar13 = (ulong)(uVar3 + 1);
        pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar13 < (pBVar4->super_RawBufferView).num) {
          fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                  super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar23 = ZEXT416((uint)(fVar1 * (fVar32 / fVar20) * 1.0000002));
          auVar23 = vroundss_avx(auVar23,auVar23,9);
          auVar23 = vmaxss_avx(auVar47._0_16_,auVar23);
          auVar27 = ZEXT416((uint)(fVar1 * ((auVar46._0_4_ - fVar22) / fVar20) * 0.99999976));
          auVar27 = vroundss_avx(auVar27,auVar27,10);
          auVar27 = vminss_avx(auVar27,ZEXT416((uint)fVar1));
          if ((uint)(int)auVar23._0_4_ <= (uint)(int)auVar27._0_4_) {
            uVar17 = (ulong)(int)auVar23._0_4_;
            pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                     super_CurveGeometry.tangents.items;
            lVar16 = uVar17 * 0x38 + 0x10;
            do {
              lVar6 = *(long *)((long)pBVar4 + lVar16 + -0x10);
              lVar7 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar16);
              auVar23 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
              auVar48 = auVar49._0_16_;
              uVar12 = vcmpps_avx512vl(auVar23,auVar48,6);
              auVar50 = auVar51._0_16_;
              uVar11 = vcmpps_avx512vl(auVar23,auVar50,1);
              if ((byte)((byte)uVar12 & (byte)uVar11) != 0xf) goto LAB_01eefe48;
              auVar23 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar13);
              uVar12 = vcmpps_avx512vl(auVar23,auVar48,6);
              uVar11 = vcmpps_avx512vl(auVar23,auVar50,1);
              if ((byte)((byte)uVar12 & (byte)uVar11) != 0xf) goto LAB_01eefe48;
              lVar6 = *(long *)((long)pBVar5 + lVar16 + -0x10);
              lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar16);
              auVar23 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
              uVar12 = vcmpps_avx512vl(auVar23,auVar48,6);
              uVar11 = vcmpps_avx512vl(auVar23,auVar50,1);
              if ((byte)((byte)uVar12 & (byte)uVar11) != 0xf) goto LAB_01eefe48;
              auVar23 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar13);
              uVar12 = vcmpps_avx512vl(auVar23,auVar48,6);
              uVar11 = vcmpps_avx512vl(auVar23,auVar50,1);
              if ((byte)((byte)uVar12 & (byte)uVar11) != 0xf) goto LAB_01eefe48;
              uVar17 = uVar17 + 1;
              lVar16 = lVar16 + 0x38;
            } while (uVar17 <= (ulong)(long)(int)auVar27._0_4_);
          }
          local_118.primID = &local_120;
          fVar19 = auVar24._0_4_ - fVar22;
          fVar32 = fVar32 / fVar19;
          fVar19 = (auVar46._0_4_ - fVar22) / fVar19;
          fVar20 = fVar1 * fVar32;
          fVar22 = fVar1 * fVar19;
          auVar27 = vroundss_avx(ZEXT416((uint)fVar20),ZEXT416((uint)fVar20),9);
          auVar48 = vroundss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),10);
          auVar24 = vmaxss_avx(auVar27,auVar47._0_16_);
          auVar23 = vminss_avx(auVar48,ZEXT416((uint)fVar1));
          iVar15 = (int)auVar24._0_4_;
          fVar33 = auVar23._0_4_;
          uVar3 = (int)auVar27._0_4_;
          if ((int)auVar27._0_4_ < 0) {
            uVar3 = 0xffffffff;
          }
          iVar18 = (int)fVar1 + 1;
          if ((int)auVar48._0_4_ < (int)fVar1 + 1) {
            iVar18 = (int)auVar48._0_4_;
          }
          local_120 = uVar14;
          local_118.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar15);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar33);
          fVar20 = fVar20 - auVar24._0_4_;
          if (iVar18 - uVar3 == 1) {
            auVar24 = vmaxss_avx(ZEXT416((uint)fVar20),ZEXT816(0) << 0x40);
            fVar20 = auVar24._0_4_;
            fVar32 = 1.0 - fVar20;
            auVar52._0_4_ = fVar20 * local_108.m128[0];
            auVar52._4_4_ = fVar20 * local_108.m128[1];
            auVar52._8_4_ = fVar20 * local_108.m128[2];
            auVar52._12_4_ = fVar20 * local_108.m128[3];
            auVar28._4_4_ = fVar32;
            auVar28._0_4_ = fVar32;
            auVar28._8_4_ = fVar32;
            auVar28._12_4_ = fVar32;
            auVar48 = vfmadd231ps_fma(auVar52,auVar28,(undefined1  [16])local_e8);
            auVar54._0_4_ = fVar20 * local_f8._0_4_;
            auVar54._4_4_ = fVar20 * local_f8._4_4_;
            auVar54._8_4_ = fVar20 * local_f8._8_4_;
            auVar54._12_4_ = fVar20 * local_f8._12_4_;
            auVar50 = vfmadd231ps_fma(auVar54,local_d8,auVar28);
            auVar24 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar22)),ZEXT816(0) << 0x40);
            fVar20 = auVar24._0_4_;
            fVar32 = 1.0 - fVar20;
            auVar36._0_4_ = fVar20 * local_e8.m128[0];
            auVar36._4_4_ = fVar20 * local_e8.m128[1];
            auVar36._8_4_ = fVar20 * local_e8.m128[2];
            auVar36._12_4_ = fVar20 * local_e8.m128[3];
            auVar29._4_4_ = fVar32;
            auVar29._0_4_ = fVar32;
            auVar29._8_4_ = fVar32;
            auVar29._12_4_ = fVar32;
            auVar38 = vfmadd231ps_fma(auVar36,auVar29,(undefined1  [16])local_108);
            auVar40._0_4_ = fVar20 * local_d8._0_4_;
            auVar40._4_4_ = fVar20 * local_d8._4_4_;
            auVar40._8_4_ = fVar20 * local_d8._8_4_;
            auVar40._12_4_ = fVar20 * local_d8._12_4_;
            auVar42 = vfmadd231ps_fma(auVar40,auVar29,local_f8);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar15 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar33 + -1));
            auVar24 = vmaxss_avx(ZEXT416((uint)fVar20),ZEXT816(0) << 0x40);
            fVar21 = auVar24._0_4_;
            auVar53._0_4_ = fVar21 * local_58.m128[0];
            auVar53._4_4_ = fVar21 * local_58.m128[1];
            auVar53._8_4_ = fVar21 * local_58.m128[2];
            auVar53._12_4_ = fVar21 * local_58.m128[3];
            fVar20 = 1.0 - fVar21;
            auVar25._4_4_ = fVar20;
            auVar25._0_4_ = fVar20;
            auVar25._8_4_ = fVar20;
            auVar25._12_4_ = fVar20;
            auVar48 = vfmadd231ps_fma(auVar53,auVar25,(undefined1  [16])local_e8);
            auVar55._0_4_ = fVar21 * local_48;
            auVar55._4_4_ = fVar21 * fStack_44;
            auVar55._8_4_ = fVar21 * fStack_40;
            auVar55._12_4_ = fVar21 * fStack_3c;
            auVar50 = vfmadd231ps_fma(auVar55,auVar25,local_d8);
            auVar24 = vmaxss_avx(ZEXT416((uint)(fVar33 - fVar22)),ZEXT816(0) << 0x40);
            fVar22 = auVar24._0_4_;
            fVar20 = 1.0 - fVar22;
            auVar37._0_4_ = fVar22 * local_78.m128[0];
            auVar37._4_4_ = fVar22 * local_78.m128[1];
            auVar37._8_4_ = fVar22 * local_78.m128[2];
            auVar37._12_4_ = fVar22 * local_78.m128[3];
            auVar30._4_4_ = fVar20;
            auVar30._0_4_ = fVar20;
            auVar30._8_4_ = fVar20;
            auVar30._12_4_ = fVar20;
            auVar38 = vfmadd231ps_fma(auVar37,auVar30,(undefined1  [16])local_108);
            auVar41._0_4_ = fVar22 * local_68;
            auVar41._4_4_ = fVar22 * fStack_64;
            auVar41._8_4_ = fVar22 * fStack_60;
            auVar41._12_4_ = fVar22 * fStack_5c;
            auVar42 = vfmadd231ps_fma(auVar41,auVar30,local_f8);
            if ((int)(uVar3 + 1) < iVar18) {
              itime = (size_t)(uVar3 + 1);
              iVar18 = ~uVar3 + iVar18;
              do {
                fVar22 = ((float)(int)itime / fVar1 - fVar32) / (fVar19 - fVar32);
                fVar20 = 1.0 - fVar22;
                auVar34._0_4_ = auVar38._0_4_ * fVar22;
                fVar33 = auVar38._4_4_;
                auVar34._4_4_ = fVar33 * fVar22;
                fVar21 = auVar38._8_4_;
                auVar34._8_4_ = fVar21 * fVar22;
                fVar39 = auVar38._12_4_;
                auVar34._12_4_ = fVar39 * fVar22;
                auVar31._4_4_ = fVar20;
                auVar31._0_4_ = fVar20;
                auVar31._8_4_ = fVar20;
                auVar31._12_4_ = fVar20;
                auVar24 = vfmadd231ps_fma(auVar34,auVar31,auVar48);
                auVar26._0_4_ = auVar42._0_4_ * fVar22;
                fVar20 = auVar42._4_4_;
                auVar26._4_4_ = fVar20 * fVar22;
                fVar43 = auVar42._8_4_;
                auVar26._8_4_ = fVar43 * fVar22;
                fVar44 = auVar42._12_4_;
                auVar26._12_4_ = fVar44 * fVar22;
                local_a8 = vfmadd231ps_fma(auVar26,auVar50,auVar31);
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,itime);
                local_178 = auVar50._0_4_;
                fStack_174 = auVar50._4_4_;
                fStack_170 = auVar50._8_4_;
                fStack_16c = auVar50._12_4_;
                local_168 = auVar48._0_4_;
                fStack_164 = auVar48._4_4_;
                fStack_160 = auVar48._8_4_;
                fStack_15c = auVar48._12_4_;
                auVar24 = vsubps_avx((undefined1  [16])local_98,auVar24);
                auVar27 = vsubps_avx(local_88,local_a8);
                auVar23 = vminps_avx(auVar24,ZEXT816(0) << 0x40);
                auVar24 = vmaxps_avx(auVar27,ZEXT816(0) << 0x40);
                auVar48._0_4_ = local_168 + auVar23._0_4_;
                auVar48._4_4_ = fStack_164 + auVar23._4_4_;
                auVar48._8_4_ = fStack_160 + auVar23._8_4_;
                auVar48._12_4_ = fStack_15c + auVar23._12_4_;
                auVar38._0_4_ = auVar38._0_4_ + auVar23._0_4_;
                auVar38._4_4_ = fVar33 + auVar23._4_4_;
                auVar38._8_4_ = fVar21 + auVar23._8_4_;
                auVar38._12_4_ = fVar39 + auVar23._12_4_;
                auVar50._0_4_ = local_178 + auVar24._0_4_;
                auVar50._4_4_ = fStack_174 + auVar24._4_4_;
                auVar50._8_4_ = fStack_170 + auVar24._8_4_;
                auVar50._12_4_ = fStack_16c + auVar24._12_4_;
                auVar42._0_4_ = auVar42._0_4_ + auVar24._0_4_;
                auVar42._4_4_ = fVar20 + auVar24._4_4_;
                auVar42._8_4_ = fVar43 + auVar24._8_4_;
                auVar42._12_4_ = fVar44 + auVar24._12_4_;
                itime = itime + 1;
                iVar18 = iVar18 + -1;
              } while (iVar18 != 0);
            }
          }
          auVar47 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar12 = vcmpps_avx512vl(auVar48,auVar50,2);
          auVar45 = ZEXT1664(local_b8);
          auVar46 = ZEXT1664(local_c8);
          auVar49 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar51 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if (((~(ushort)uVar12 & 7) == 0) &&
             (uVar12 = vcmpps_avx512vl(auVar38,auVar42,2), (~(ushort)uVar12 & 7) == 0)) {
            auVar24 = vminps_avx(auVar48,auVar38);
            aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar24,ZEXT416(geomID),0x30);
            auVar24 = vmaxps_avx(auVar50,auVar42);
            aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                     vinsertps_avx(auVar24,ZEXT416((uint)uVar14),0x30);
            auVar35._0_4_ = aVar9.x + aVar10.x;
            auVar35._4_4_ = aVar9.y + aVar10.y;
            auVar35._8_4_ = aVar9.z + aVar10.z;
            auVar35._12_4_ = aVar9.field_3.w + aVar10.field_3.w;
            local_1b8 = vminps_avx(local_1b8,(undefined1  [16])aVar9);
            local_1a8 = vmaxps_avx(local_1a8,(undefined1  [16])aVar10);
            local_188 = vminps_avx(local_188,auVar35);
            local_198 = vmaxps_avx(local_198,auVar35);
            local_1f0 = local_1f0 + 1;
            prims[local_1c0].lower.field_0.field_1 = aVar9;
            prims[local_1c0].upper.field_0.field_1 = aVar10;
            local_1c0 = local_1c0 + 1;
          }
        }
LAB_01eefe48:
        uVar14 = uVar14 + 1;
      } while (uVar14 < r->_end);
    }
    else {
      local_1f0 = 0;
      local_1a8._8_4_ = 0xff800000;
      local_1a8._0_8_ = 0xff800000ff800000;
      local_1a8._12_4_ = 0xff800000;
      local_1b8._8_4_ = 0x7f800000;
      local_1b8._0_8_ = 0x7f8000007f800000;
      local_1b8._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_1b8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_1b8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_1a8._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_1a8._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1f0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }